

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel.h
# Opt level: O2

string * __thiscall
Dashel::Stream::getTargetName_abi_cxx11_(string *__return_storage_ptr__,Stream *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x78),
                 ":");
  Dashel::ParameterSet::getString_abi_cxx11_();
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string getTargetName() const { return protocolName + ":" + target.getString(); }